

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O3

shared_ptr<chrono::ChBody> __thiscall
chrono::fea::ChLoadXYZROTnodeBody::GetBodyB(ChLoadXYZROTnodeBody *this)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long in_RSI;
  undefined1 auVar4 [16];
  shared_ptr<chrono::ChBody> sVar5;
  
  lVar1 = *(long *)(in_RSI + 0x40);
  lVar2 = *(long *)(lVar1 + 0x10);
  if (lVar2 != 0) {
    auVar4 = __dynamic_cast(lVar2,&ChLoadable::typeinfo,&ChBody::typeinfo,0xffffffffffffffff);
    in_RDX._M_pi = auVar4._8_8_;
    if (auVar4._0_8_ != (_func_int **)0x0) {
      (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj = auVar4._0_8_;
      pcVar3 = *(pointer *)(lVar1 + 0x18);
      (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj.m_name._M_dataplus._M_p =
           pcVar3;
      if (pcVar3 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(pcVar3 + 8) = *(int *)(pcVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(pcVar3 + 8) = *(int *)(pcVar3 + 8) + 1;
        }
      }
      goto LAB_00640b0e;
    }
  }
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj = (_func_int **)0x0;
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj.m_name._M_dataplus._M_p =
       (pointer)0x0;
LAB_00640b0e:
  sVar5.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<chrono::ChBody>)
         sVar5.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChBody> ChLoadXYZROTnodeBody::GetBodyB() const {
    return std::dynamic_pointer_cast<ChBody>(this->loadables[1]);
}